

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_smooth.c
# Opt level: O0

REF_STATUS ref_smooth_tri_pliant_uv(REF_GRID ref_grid,REF_INT node,REF_DBL *ideal_uv)

{
  uint uVar1;
  REF_DBL check_dxyz [3];
  REF_DBL dn;
  REF_DBL dv;
  REF_DBL du;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_BOOL self_check;
  REF_DBL n [3];
  REF_DBL local_398;
  REF_DBL s [3];
  REF_DBL local_378;
  REF_DBL r [3];
  REF_DBL local_358;
  REF_DBL duvn_dxyz [9];
  REF_DBL local_308;
  REF_DBL dxyz_duvn [9];
  REF_DBL local_2b8;
  REF_DBL dxyz_duv [15];
  REF_DBL local_238;
  REF_DBL xyz_orig [3];
  double local_218;
  REF_DBL dxyz [3];
  REF_DBL local_1f8;
  REF_DBL total_force [3];
  REF_INT local_1d8;
  REF_INT edge;
  REF_INT node_list [100];
  REF_INT nnode;
  REF_INT max_node;
  REF_INT id;
  REF_INT ixyz;
  REF_NODE ref_node;
  REF_GEOM ref_geom;
  REF_DBL *ideal_uv_local;
  REF_GRID pRStack_18;
  REF_INT node_local;
  REF_GRID ref_grid_local;
  
  ref_node = (REF_NODE)ref_grid->geom;
  _id = ref_grid->node;
  node_list[99] = 100;
  ref_geom = (REF_GEOM)ideal_uv;
  ideal_uv_local._4_4_ = node;
  pRStack_18 = ref_grid;
  ref_grid_local._4_4_ = ref_geom_unique_id((REF_GEOM)ref_node,node,2,&nnode);
  if (ref_grid_local._4_4_ == 0) {
    ref_grid_local._4_4_ =
         ref_geom_tuv((REF_GEOM)ref_node,ideal_uv_local._4_4_,2,nnode,(REF_DBL *)ref_geom);
    if (ref_grid_local._4_4_ == 0) {
      ref_grid_local._4_4_ =
           ref_cell_node_list_around
                     (pRStack_18->cell[3],ideal_uv_local._4_4_,node_list[99],node_list + 0x62,
                      &local_1d8);
      if (ref_grid_local._4_4_ == 0) {
        for (max_node = 0; max_node < 3; max_node = max_node + 1) {
          total_force[(long)max_node + -1] = 0.0;
        }
        for (total_force[2]._4_4_ = 0; total_force[2]._4_4_ < node_list[0x62];
            total_force[2]._4_4_ = total_force[2]._4_4_ + 1) {
          uVar1 = ref_smooth_add_pliant_force
                            (_id,ideal_uv_local._4_4_,(&local_1d8)[total_force[2]._4_4_],&local_1f8)
          ;
          if (uVar1 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x253,"ref_smooth_tri_pliant_uv",(ulong)uVar1,"edge");
            return uVar1;
          }
        }
        for (max_node = 0; max_node < 3; max_node = max_node + 1) {
          dxyz[(long)max_node + -1] =
               pRStack_18->adapt->smooth_pliant_alpha * total_force[(long)max_node + -1];
        }
        ref_grid_local._4_4_ =
             ref_egads_eval_at((REF_GEOM)ref_node,2,nnode,(REF_DBL *)ref_geom,&local_238,&local_2b8)
        ;
        if (ref_grid_local._4_4_ == 0) {
          ref_grid_local._4_4_ =
               ref_geom_face_rsn((REF_GEOM)ref_node,nnode,(REF_DBL *)ref_geom,&local_378,&local_398,
                                 (REF_DBL *)&ref_private_macro_code_rss);
          if (ref_grid_local._4_4_ == 0) {
            for (max_node = 0; max_node < 3; max_node = max_node + 1) {
              dxyz_duvn[(long)max_node + -1] = dxyz_duv[(long)max_node + -1];
              dxyz_duvn[(long)(max_node + 3) + -1] = dxyz_duv[(long)(max_node + 3) + -1];
              dxyz_duvn[(long)(max_node + 6) + -1] =
                   *(REF_DBL *)(&ref_private_macro_code_rss + (long)max_node * 2);
            }
            ref_grid_local._4_4_ = ref_matrix_inv_gen(3,&local_308,&local_358);
            if (ref_grid_local._4_4_ == 0) {
              for (max_node = 0; max_node < 3; max_node = max_node + 1) {
                *(double *)ref_geom =
                     duvn_dxyz[(long)(max_node * 3) + -1] * dxyz[(long)max_node + -1] +
                     *(double *)ref_geom;
                *(double *)&ref_geom->blank =
                     duvn_dxyz[(long)(max_node * 3 + 1) + -1] * dxyz[(long)max_node + -1] +
                     *(double *)&ref_geom->blank;
              }
              ref_grid_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                     ,0x266,"ref_smooth_tri_pliant_uv",(ulong)ref_grid_local._4_4_,
                     "inverse transformation");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c"
                   ,0x25e,"ref_smooth_tri_pliant_uv",(ulong)ref_grid_local._4_4_,
                   "eval orthonormal face system");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
                 0x25c,"ref_smooth_tri_pliant_uv",(ulong)ref_grid_local._4_4_,
                 "eval face derivatives");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
               0x24d,"ref_smooth_tri_pliant_uv",(ulong)ref_grid_local._4_4_,"node list for edges");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",
             0x249,"ref_smooth_tri_pliant_uv",(ulong)ref_grid_local._4_4_,"get uv_orig");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_smooth.c",0x248,
           "ref_smooth_tri_pliant_uv",(ulong)ref_grid_local._4_4_,"get id");
  }
  return ref_grid_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_smooth_tri_pliant_uv(REF_GRID ref_grid,
                                                   REF_INT node,
                                                   REF_DBL *ideal_uv) {
  REF_GEOM ref_geom = ref_grid_geom(ref_grid);
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT ixyz, id;
  REF_INT max_node = 100, nnode;
  REF_INT node_list[100];
  REF_INT edge;
  REF_DBL total_force[3], dxyz[3], xyz_orig[3], dxyz_duv[15];
  REF_DBL dxyz_duvn[9], duvn_dxyz[9], r[3], s[3], n[3];
  REF_BOOL self_check = REF_FALSE;

  RSS(ref_geom_unique_id(ref_geom, node, REF_GEOM_FACE, &id), "get id");
  RSS(ref_geom_tuv(ref_geom, node, REF_GEOM_FACE, id, ideal_uv), "get uv_orig");

  RSS(ref_cell_node_list_around(ref_grid_tri(ref_grid), node, max_node, &nnode,
                                node_list),
      "node list for edges");

  for (ixyz = 0; ixyz < 3; ixyz++) total_force[ixyz] = 0.0;
  for (edge = 0; edge < nnode; edge++) {
    RSS(ref_smooth_add_pliant_force(ref_node, node, node_list[edge],
                                    total_force),
        "edge");
  }

  for (ixyz = 0; ixyz < 3; ixyz++)
    dxyz[ixyz] =
        ref_grid_adapt(ref_grid, smooth_pliant_alpha) * total_force[ixyz];

  RSS(ref_egads_eval_at(ref_geom, REF_GEOM_FACE, id, ideal_uv, xyz_orig,
                        dxyz_duv),
      "eval face derivatives");
  RSS(ref_geom_face_rsn(ref_geom, id, ideal_uv, r, s, n),
      "eval orthonormal face system");

  for (ixyz = 0; ixyz < 3; ixyz++) {
    dxyz_duvn[ixyz + 0] = dxyz_duv[ixyz + 0];
    dxyz_duvn[ixyz + 3] = dxyz_duv[ixyz + 3];
    dxyz_duvn[ixyz + 6] = n[ixyz];
  }

  RSS(ref_matrix_inv_gen(3, dxyz_duvn, duvn_dxyz), "inverse transformation");

  for (ixyz = 0; ixyz < 3; ixyz++) {
    ideal_uv[0] += duvn_dxyz[0 + 3 * ixyz] * dxyz[ixyz];
    ideal_uv[1] += duvn_dxyz[1 + 3 * ixyz] * dxyz[ixyz];
  }

  if (self_check) {
    REF_DBL du, dv, dn, check_dxyz[3];
    du = 0;
    dv = 0;
    dn = 0;
    for (ixyz = 0; ixyz < 3; ixyz++) {
      du += duvn_dxyz[0 + 3 * ixyz] * dxyz[ixyz];
      dv += duvn_dxyz[1 + 3 * ixyz] * dxyz[ixyz];
      dn += duvn_dxyz[2 + 3 * ixyz] * dxyz[ixyz];
    }
    check_dxyz[0] = du * dxyz_duv[0] + dv * dxyz_duv[3] + dn * n[0];
    check_dxyz[1] = du * dxyz_duv[1] + dv * dxyz_duv[4] + dn * n[1];
    check_dxyz[2] = du * dxyz_duv[2] + dv * dxyz_duv[5] + dn * n[2];
    if (ABS(check_dxyz[0] - dxyz[0]) > 1.0e-12 ||
        ABS(check_dxyz[1] - dxyz[1]) > 1.0e-12 ||
        ABS(check_dxyz[2] - dxyz[2]) > 1.0e-12) {
      printf("du %f dv %f dn %f dxyz %f %f %f\n", du, dv, dn, dxyz[0], dxyz[1],
             dxyz[2]);
      printf(" err %e %e %e\n", check_dxyz[0] - dxyz[0],
             check_dxyz[1] - dxyz[1], check_dxyz[2] - dxyz[2]);
      ref_node_location(ref_node, node);
    }
  }

  return REF_SUCCESS;
}